

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O0

bool __thiscall
Rml::DecoratorTiledBox::Initialise(DecoratorTiledBox *this,Tile *_tiles,Texture *_textures)

{
  int iVar1;
  int local_44;
  int i_1;
  int local_2c;
  int i;
  Texture *_textures_local;
  Tile *_tiles_local;
  DecoratorTiledBox *this_local;
  
  for (local_2c = 0; local_2c < 9; local_2c = local_2c + 1) {
    memcpy(&this->field_0x30 + (long)local_2c * 0x4c,_tiles + local_2c,0x4c);
    iVar1 = Decorator::AddTexture((Decorator *)this,_textures[local_2c]);
    *(int *)(&this->field_0x30 + (long)local_2c * 0x4c) = iVar1;
  }
  for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
    if (*(int *)(&this->field_0x30 + (long)local_44 * 0x4c) == -1) {
      return false;
    }
  }
  if (*(int *)&this->field_0x290 < 0) {
    this_local._7_1_ = false;
  }
  else {
    if ((*(int *)&this->field_0x160 == -1) && (-1 < *(int *)&this->field_0x1ac)) {
      memcpy(&this->field_0x160,&this->field_0x1ac,0x4c);
      *(undefined4 *)&this->field_0x194 = 1;
    }
    else if ((*(int *)&this->field_0x1ac == -1) && (-1 < *(int *)&this->field_0x160)) {
      memcpy(&this->field_0x1ac,&this->field_0x160,0x4c);
      *(undefined4 *)&this->field_0x1e0 = 1;
    }
    else if ((*(int *)&this->field_0x160 == -1) && (*(int *)&this->field_0x1ac == -1)) {
      return false;
    }
    if ((*(int *)&this->field_0x1f8 == -1) && (-1 < *(int *)&this->field_0x244)) {
      memcpy(&this->field_0x1f8,&this->field_0x244,0x4c);
      *(undefined4 *)&this->field_0x22c = 2;
    }
    else if ((*(int *)&this->field_0x244 == -1) && (-1 < *(int *)&this->field_0x1f8)) {
      memcpy(&this->field_0x244,&this->field_0x1f8,0x4c);
      *(undefined4 *)&this->field_0x278 = 2;
    }
    else if ((*(int *)&this->field_0x1f8 == -1) && (*(int *)&this->field_0x244 == -1)) {
      return false;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DecoratorTiledBox::Initialise(const Tile* _tiles, const Texture* _textures)
{
	// Load the textures.
	for (int i = 0; i < 9; i++)
	{
		tiles[i] = _tiles[i];
		tiles[i].texture_index = AddTexture(_textures[i]);
	}

	// All corners must have a valid texture.
	for (int i = TOP_LEFT_CORNER; i <= BOTTOM_RIGHT_CORNER; i++)
	{
		if (tiles[i].texture_index == -1)
			return false;
	}
	// Check that the centre tile has been specified.
	if (tiles[CENTRE].texture_index < 0)
		return false;

	// If only one side of the left / right edges have been configured, then mirror the tile for the other side.
	if (tiles[LEFT_EDGE].texture_index == -1 && tiles[RIGHT_EDGE].texture_index > -1)
	{
		tiles[LEFT_EDGE] = tiles[RIGHT_EDGE];
		tiles[LEFT_EDGE].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[RIGHT_EDGE].texture_index == -1 && tiles[LEFT_EDGE].texture_index > -1)
	{
		tiles[RIGHT_EDGE] = tiles[LEFT_EDGE];
		tiles[RIGHT_EDGE].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[LEFT_EDGE].texture_index == -1 && tiles[RIGHT_EDGE].texture_index == -1)
		return false;

	// If only one side of the top / bottom edges have been configured, then mirror the tile for the other side.
	if (tiles[TOP_EDGE].texture_index == -1 && tiles[BOTTOM_EDGE].texture_index > -1)
	{
		tiles[TOP_EDGE] = tiles[BOTTOM_EDGE];
		tiles[TOP_EDGE].orientation = FLIP_VERTICAL;
	}
	else if (tiles[BOTTOM_EDGE].texture_index == -1 && tiles[TOP_EDGE].texture_index > -1)
	{
		tiles[BOTTOM_EDGE] = tiles[TOP_EDGE];
		tiles[BOTTOM_EDGE].orientation = FLIP_VERTICAL;
	}
	else if (tiles[TOP_EDGE].texture_index == -1 && tiles[BOTTOM_EDGE].texture_index == -1)
		return false;

	return true;
}